

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::Tanh_ex::back(Tanh_ex *this)

{
  bool bVar1;
  Mat *this_00;
  Mat *a;
  long in_RDI;
  Mat *in_stack_fffffffffffffeb8;
  ll128 *in_stack_fffffffffffffec0;
  Mat *in_stack_fffffffffffffec8;
  Mat *this_01;
  Mat *in_stack_fffffffffffffed0;
  Mat *in_stack_fffffffffffffed8;
  
  *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
  bVar1 = NeuronMat::getIsBack(*(NeuronMat **)(in_RDI + 0x20));
  if (!bVar1) {
    this_00 = NeuronMat::getForward(*(NeuronMat **)(in_RDI + 0x28));
    NeuronMat::getForward(*(NeuronMat **)(in_RDI + 0x28));
    Mat::oneMinus_IE(in_stack_fffffffffffffeb8);
    Mat::dot(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    Mat::operator/(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    a = NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x20));
    Mat::operator=(this_00,a);
    Mat::~Mat((Mat *)0x1321d5);
    Mat::~Mat((Mat *)0x1321e2);
    Mat::~Mat((Mat *)0x1321ef);
    NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x20));
    NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x28));
    Mat::dot(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    this_01 = (Mat *)0x2;
    Mat::operator*((Mat *)0x2,in_stack_fffffffffffffec0);
    Mat::operator/(this_01,(ll128 *)0x0);
    NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x20));
    Mat::operator=(this_00,a);
    Mat::~Mat((Mat *)0x1322b9);
    Mat::~Mat((Mat *)0x1322c6);
    Mat::~Mat((Mat *)0x1322d0);
  }
  return;
}

Assistant:

void MathOp::Tanh_ex::back(){
    backRound++;
    if (!a->getIsBack()){
        *a->getGrad()=res->getForward()->dot(res->getForward()->oneMinus_IE())/IE;
        *a->getGrad()=a->getGrad()->dot(*res->getGrad())*2/IE;
    }
/*cout<<"result.grad:"<<endl;
    res->getGrad()->print();
    cout<<"a.grad:"<<endl;
    a->getGrad()->print();*/

}